

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

bool crnlib::get_dxt_format_has_alpha(dxt_format fmt)

{
  return (bool)((byte)(0xa1e >> ((byte)fmt & 0x1f)) & (uint)fmt < 0xc);
}

Assistant:

bool get_dxt_format_has_alpha(dxt_format fmt)
    {
        switch (fmt)
        {
        case cDXT1A:
        case cDXT3:
        case cDXT5:
        case cDXT5A:
        case cETC2A:
        case cETC2AS:
            return true;
        default:
            break;
        }
        return false;
    }